

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_rate.c
# Opt level: O3

double inform_entropy_rate(int *series,size_t n,size_t m,int b,size_t k,inform_error *err)

{
  _Bool _Var1;
  ulong uVar2;
  uint32_t *__ptr;
  size_t sVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  double dVar9;
  undefined1 auVar10 [16];
  inform_dist histories;
  inform_dist states;
  inform_dist local_60;
  inform_dist local_48;
  
  _Var1 = check_arguments(series,n,m,b,k,err);
  dVar9 = NAN;
  if (!_Var1) {
    auVar10._8_4_ = (int)(k >> 0x20);
    auVar10._0_8_ = k;
    auVar10._12_4_ = 0x45300000;
    dVar9 = pow((double)b,
                (auVar10._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
    dVar9 = dVar9 * (double)b;
    uVar2 = (ulong)dVar9;
    uVar2 = (long)(dVar9 - 9.223372036854776e+18) & (long)uVar2 >> 0x3f | uVar2;
    __ptr = (uint32_t *)calloc(uVar2 / (ulong)(long)b + uVar2,4);
    if (__ptr == (uint32_t *)0x0) {
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      dVar9 = NAN;
    }
    else {
      local_60.counts = (m - k) * n;
      local_60.histogram = __ptr + uVar2;
      if (n != 0) {
        sVar3 = 0;
        do {
          if (k == 0) {
            iVar4 = 1;
            iVar5 = 0;
          }
          else {
            sVar7 = 0;
            iVar4 = 1;
            iVar5 = 0;
            do {
              iVar4 = iVar4 * b;
              iVar5 = iVar5 * b + series[sVar7];
              sVar7 = sVar7 + 1;
            } while (k != sVar7);
          }
          if (k < m) {
            lVar8 = 0;
            do {
              lVar6 = (long)(iVar5 * b) + (long)series[k + lVar8];
              __ptr[lVar6] = __ptr[lVar6] + 1;
              local_60.histogram[iVar5] = local_60.histogram[iVar5] + 1;
              iVar5 = (int)lVar6 - series[lVar8] * iVar4;
              lVar8 = lVar8 + 1;
            } while (m - k != lVar8);
          }
          sVar3 = sVar3 + 1;
          series = series + m;
        } while (sVar3 != n);
      }
      local_60.size = uVar2 / (ulong)(long)b;
      local_48.histogram = __ptr;
      local_48.size = uVar2;
      local_48.counts = local_60.counts;
      dVar9 = inform_shannon_ce(&local_48,&local_60,2.0);
      free(__ptr);
    }
  }
  return dVar9;
}

Assistant:

double inform_entropy_rate(int const *series, size_t n, size_t m, int b,
    size_t k, inform_error *err)
{
    if (check_arguments(series, n, m, b, k, err)) return NAN;

    size_t const N = n * (m - k);

    size_t const states_size = (size_t) (b * pow((double) b, (double) k));
    size_t const histories_size = states_size / b;
    size_t const total_size = states_size + histories_size;

    uint32_t *data = calloc(total_size, sizeof(uint32_t));
    if (data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NAN);
    }

    inform_dist states    = { data, states_size, N };
    inform_dist histories = { data + states_size, histories_size, N };

    accumulate_observations(series, n, m, b, k, &states, &histories);

    double er = inform_shannon_ce(&states, &histories, 2.0);

    free(data);

    return er;
}